

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O1

void __thiscall bgui::anon_unknown_0::X11Exception::X11Exception(X11Exception *this,string *message)

{
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"X11","");
  gutil::Exception::Exception(&this->super_Exception,(string *)local_40,(string *)message);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  *(undefined ***)&this->super_Exception = &PTR__Exception_00121c48;
  return;
}

Assistant:

X11Exception(const std::string &message) :
      gutil::Exception("X11", message) { }